

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall
ON_RdkMaterialInstanceIdObsoleteUserData::Write
          (ON_RdkMaterialInstanceIdObsoleteUserData *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  int i;
  char *pcVar2;
  ON_String s;
  char s__rdk_material_instance_id [37];
  ON_String local_50;
  char local_48 [48];
  
  ON_String::ON_String(&local_50,"<xml>\n<render-content-manager-data>\n<material instance-id=\"");
  pcVar2 = ON_UuidToString(&this->m_rdk_material_instance_id,local_48);
  ON_String::operator+=(&local_50,pcVar2);
  ON_String::operator+=(&local_50,"\" name=\"\" />\n</render-content-manager-data>\n</xml>");
  i = ON_String::Length(&local_50);
  pcVar2 = ON_String::Array(&local_50);
  bVar1 = ON_BinaryArchive::WriteInt(archive,2);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteInt(archive,i);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::WriteByte(archive,(long)i,pcVar2);
      goto LAB_004dc501;
    }
  }
  bVar1 = false;
LAB_004dc501:
  ON_String::~ON_String(&local_50);
  return bVar1;
}

Assistant:

bool ON_RdkMaterialInstanceIdObsoleteUserData::Write(
  ON_BinaryArchive& archive
  ) const
{
  // write xml the CRhRdkUserData::Write() function
  // put into V5 files and V6 files written before May 16, 2014.

  char s__rdk_material_instance_id[37];
  ON_String s =
    "<xml>\n"
    "<render-content-manager-data>\n"
    "<material instance-id=\"";
   s += ON_UuidToString(m_rdk_material_instance_id, s__rdk_material_instance_id);
   s +=
    "\" name=\"\" />\n"
    "</render-content-manager-data>\n"
    "</xml>";
   const int s_length = (int)s.Length();
   const char* s_array = s.Array();
   bool rc
     =  archive.WriteInt(2) // "2" was a version number used in V5 files
     && archive.WriteInt(s_length)
     && archive.WriteByte(s_length, s_array);
   return rc;
}